

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O0

intrusive_ptr<booster::details::key> booster::details::make_key(_func_void_void_ptr *dtor)

{
  key *p;
  key *in_RDI;
  pthread_key *unaff_retaddr;
  intrusive_ptr<booster::details::key> *in_stack_ffffffffffffffe0;
  key *d;
  
  d = in_RDI;
  p = (key *)operator_new(0x20);
  pthread_key::pthread_key(unaff_retaddr,(_func_void_void_ptr *)d);
  intrusive_ptr<booster::details::key>::intrusive_ptr
            (in_stack_ffffffffffffffe0,p,SUB81((ulong)in_RDI >> 0x38,0));
  return (intrusive_ptr<booster::details::key>)in_RDI;
}

Assistant:

intrusive_ptr<key> make_key(void (*dtor)(void *))
		{
			return new pthread_key(dtor);
		}